

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MosquitoNet.h
# Opt level: O1

Stats * __thiscall
Enhedron::Test::Impl::Impl_Suite::
Runner<Enhedron::Test::Impl::Impl_Suite::RunTest<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp:35:38)>_>
::run(Stats *__return_storage_ptr__,
     Runner<Enhedron::Test::Impl::Impl_Suite::RunTest<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_VectorTest_hpp:35:38)>_>
     *this,PathList *pathList,Out<Enhedron::Test::Impl::Impl_Suite::ContextResultsRecorder> results,
     size_t depth)

{
  long *plVar1;
  long *plVar2;
  Results *pRVar3;
  pointer pcVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long *local_108;
  undefined8 local_100;
  undefined1 local_f8;
  undefined7 uStack_f7;
  undefined8 uStack_f0;
  long *local_e8;
  undefined8 local_e0;
  long local_d8;
  undefined8 uStack_d0;
  undefined **local_c8;
  undefined8 local_c0;
  long lStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  void *pvStack_98;
  long local_90;
  long lStack_88;
  undefined **local_80;
  ContextResultsRecorder *local_78;
  long *local_70;
  undefined8 local_68;
  long local_60;
  undefined8 uStack_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  undefined8 uStack_38;
  
  pRVar3 = ((results.value)->results_).value;
  (*pRVar3->_vptr_Results[5])(pRVar3,&(results.value)->contextStack_,&this->name);
  __return_storage_ptr__->checks_ = 0;
  __return_storage_ptr__->failedTests_ = 0;
  __return_storage_ptr__->fixtures_ = 0;
  __return_storage_ptr__->tests_ = 0;
  __return_storage_ptr__->failedChecks_ = 0;
  bVar5 = included(this,pathList,depth);
  if (bVar5) {
    pcVar4 = (this->name)._M_dataplus._M_p;
    local_108 = (long *)&local_f8;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_108,pcVar4,pcVar4 + (this->name)._M_string_length);
    local_68 = local_100;
    local_c8 = &PTR__WhenRunner_0016ec28;
    local_b0 = 0;
    uStack_a8 = 0;
    local_a0 = 0;
    pvStack_98 = (void *)0x0;
    lStack_88 = 0;
    if (local_108 == (long *)&local_f8) {
      uStack_d0 = uStack_f0;
      local_e8 = &local_d8;
    }
    else {
      local_e8 = local_108;
    }
    local_d8 = CONCAT71(uStack_f7,local_f8);
    local_e0 = local_100;
    local_100 = 0;
    local_f8 = 0;
    local_70 = &local_60;
    local_80 = &PTR__WhenResultRecorder_0016ec78;
    if (local_e8 == &local_d8) {
      uStack_58 = uStack_d0;
    }
    else {
      local_70 = local_e8;
    }
    local_60 = local_d8;
    local_50.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_50.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_50.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_90 = 0;
    uStack_38 = 0;
    local_c0 = 1;
    lVar6 = 0;
    lVar8 = lVar6;
    lVar10 = 0;
    while( true ) {
      lVar9 = 0;
      if (lVar6 != 0) {
        do {
          *(undefined8 *)(lVar9 + 8) = 0;
          lVar9 = lVar9 + 0x10;
        } while (lVar9 != lVar6);
      }
      lVar9 = lVar10 + 1;
      if (lVar6 == 0) break;
      lVar7 = lVar6;
      if (*(long *)(lVar8 + -8) == *(long *)(lVar8 + -0x10) + 1) {
        do {
          lVar6 = lVar7 + -0x10;
          local_90 = lVar6;
          if (lVar6 == 0) goto LAB_00133893;
          plVar1 = (long *)(lVar7 + -0x20);
          plVar2 = (long *)(lVar7 + -0x18);
          lVar8 = lVar6;
          lVar7 = lVar6;
        } while (*plVar2 == *plVar1 + 1);
      }
      *(long *)(lVar6 + -0x10) = *(long *)(lVar6 + -0x10) + 1;
      lVar10 = lVar9;
    }
LAB_00133893:
    lVar6 = lVar10 + 2;
    if (lVar9 != 0) {
      lVar6 = lVar9;
    }
    local_108 = (long *)&local_f8;
    lStack_b8 = lVar6;
    local_78 = results.value;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_50);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (pvStack_98 != (void *)0x0) {
      operator_delete(pvStack_98,lStack_88 - (long)pvStack_98);
    }
    __return_storage_ptr__->fixtures_ = __return_storage_ptr__->fixtures_ + 1;
    __return_storage_ptr__->tests_ = __return_storage_ptr__->tests_ + lVar6;
    __return_storage_ptr__->checks_ = __return_storage_ptr__->checks_;
    __return_storage_ptr__->failedTests_ = __return_storage_ptr__->failedTests_;
    __return_storage_ptr__->failedChecks_ = __return_storage_ptr__->failedChecks_;
  }
  pRVar3 = ((results.value)->results_).value;
  (*pRVar3->_vptr_Results[6])
            (pRVar3,__return_storage_ptr__,&(results.value)->contextStack_,&this->name);
  return __return_storage_ptr__;
}

Assistant:

virtual Stats run(const PathList& pathList, Out<ContextResultsRecorder> results, size_t depth) override {
            results->beginGiven(name);
            Stats stats;

            if (included(pathList, depth)) {
                stats += args.applyExtraBefore(runTest, name, results);
            }

            results->endGiven(stats, name);

            return stats;
        }